

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_local_time_abi_cxx11_
          (serializer<toml::type_config> *this,local_time_type *t,bool has_seconds,
          size_t subsec_prec)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ostream *__n;
  ostream *poVar2;
  byte in_CL;
  byte *in_RDX;
  string_type *in_RDI;
  long in_R8;
  string subsec_str;
  ostringstream subsec;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  string local_398 [64];
  int local_358;
  char local_351;
  int local_350;
  char local_349;
  int local_348;
  char local_341;
  ostringstream local_340 [376];
  int local_1c8;
  char local_1c1;
  int local_1c0;
  char local_1b9;
  int local_1b8;
  char local_1a1;
  ostringstream local_1a0 [376];
  long local_28;
  byte local_19;
  byte *local_18;
  
  local_19 = in_CL & 1;
  local_28 = in_R8;
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1a1 = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(local_1a0,local_1a1);
  local_1b8 = (int)CLI::std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1b8);
  std::ostream::operator<<(poVar1,(uint)*local_18);
  std::operator<<((ostream *)local_1a0,':');
  local_1b9 = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(local_1a0,local_1b9);
  local_1c0 = (int)CLI::std::setw(2);
  poVar1 = std::operator<<(poVar1,(_Setw)local_1c0);
  std::ostream::operator<<(poVar1,(uint)local_18[1]);
  if ((local_19 & 1) != 0) {
    std::operator<<((ostream *)local_1a0,':');
    local_1c1 = (char)std::setfill<char>('0');
    in_stack_fffffffffffffc08 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(local_1a0,local_1c1);
    local_1c8 = (int)CLI::std::setw(2);
    poVar1 = std::operator<<((ostream *)in_stack_fffffffffffffc08,(_Setw)local_1c8);
    std::ostream::operator<<(poVar1,(uint)local_18[2]);
    if (local_28 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_340);
      local_341 = (char)std::setfill<char>('0');
      poVar1 = std::operator<<(local_340,local_341);
      local_348 = (int)CLI::std::setw(3);
      poVar1 = std::operator<<(poVar1,(_Setw)local_348);
      std::ostream::operator<<(poVar1,(uint)*(ushort *)(local_18 + 4));
      local_349 = (char)std::setfill<char>('0');
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::operator<<(local_340,local_349);
      local_350 = (int)CLI::std::setw(3);
      poVar1 = std::operator<<((ostream *)this_00,(_Setw)local_350);
      std::ostream::operator<<(poVar1,(uint)*(ushort *)(local_18 + 6));
      local_351 = (char)std::setfill<char>('0');
      __n = std::operator<<(local_340,local_351);
      local_358 = (int)CLI::std::setw(3);
      in_stack_fffffffffffffbd0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(__n,(_Setw)local_358);
      std::ostream::operator<<(in_stack_fffffffffffffbd0,(uint)*(ushort *)(local_18 + 8));
      std::__cxx11::ostringstream::str();
      poVar2 = std::operator<<((ostream *)local_1a0,'.');
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this_00,(size_type)poVar1,(size_type)__n);
      std::operator<<(poVar2,local_398);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
      std::__cxx11::ostringstream::~ostringstream(local_340);
    }
  }
  std::__cxx11::ostringstream::str();
  string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_fffffffffffffc08);
  std::__cxx11::string::~string(in_stack_fffffffffffffbd0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

string_type format_local_time(const local_time_type& t, const bool has_seconds, const std::size_t subsec_prec) // {{{
    {
        std::ostringstream oss;
        oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.hour);
        oss << ':';
        oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.minute);
        if(has_seconds)
        {
            oss << ':';
            oss << std::setfill('0') << std::setw(2) << static_cast<int>(t.second);
            if(subsec_prec != 0)
            {
                std::ostringstream subsec;
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.millisecond);
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.microsecond);
                subsec << std::setfill('0') << std::setw(3) << static_cast<int>(t.nanosecond);
                std::string subsec_str = subsec.str();
                oss << '.' << subsec_str.substr(0, subsec_prec);
            }
        }
        return string_conv<string_type>(oss.str());
    }